

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall
ImageTexture::ImageTexture(ImageTexture *this,uchar *data,uint width,uint height,uint type)

{
  undefined8 uVar1;
  QueueItem *pQVar2;
  bool bVar3;
  atomic<unsigned_long> *paVar4;
  atomic<unsigned_long> *paVar5;
  uint8_t *puVar6;
  GpuCtxWrapper *pGVar7;
  ExplicitProducer *pEVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte local_53e;
  byte local_53d;
  uint local_53c;
  GpuCtxScope ___tracy_gpu_zone;
  uint uStack_538;
  ScopedZone ___tracy_scoped_zone;
  uint type_local;
  uint height_local;
  uint width_local;
  uchar *data_local;
  ImageTexture *this_local;
  QueueItem *item;
  atomic<unsigned_long> *__tail;
  ExplicitProducer *__token;
  index_t __magic;
  SourceLocationData *local_4f8;
  byte *local_4f0;
  QueueItem *local_4e8;
  QueueItem *item_1;
  atomic<unsigned_long> *__tail_1;
  ExplicitProducer *__token_1;
  index_t __magic_1;
  uint queryId;
  byte *local_4b8;
  QueueItem *local_4b0;
  QueueItem *item_2;
  atomic<unsigned_long> *__tail_2;
  ExplicitProducer *__token_2;
  index_t __magic_2;
  byte *pbStack_488;
  uint queryId_1;
  QueueItem *item_4;
  atomic<unsigned_long> *__tail_4;
  ExplicitProducer *__token_4;
  index_t __magic_4;
  uint queryId_2;
  QueueItem *local_450;
  QueueItem *item_3;
  atomic<unsigned_long> *__tail_3;
  ExplicitProducer *__token_3;
  index_t __magic_3;
  QueueItem *item_5;
  atomic<unsigned_long> *__tail_5;
  ExplicitProducer *__token_5;
  index_t __magic_5;
  ExplicitProducer *local_3f8;
  ExplicitProducer *local_3e8;
  ExplicitProducer *local_3e0;
  ExplicitProducer *local_3d8;
  ExplicitProducer **local_3c0;
  ExplicitProducer *local_3b8;
  ExplicitProducer **local_3a0;
  ExplicitProducer *local_398;
  ExplicitProducer **local_390;
  ExplicitProducer *local_388;
  ExplicitProducer **local_380;
  ExplicitProducer *local_378;
  undefined1 local_359;
  QueueItem *local_358;
  undefined1 local_339;
  QueueItem *local_338;
  undefined1 local_329;
  QueueItem *local_328;
  undefined1 local_319;
  QueueItem *local_318;
  long local_300;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2f8;
  long local_2e0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2d8;
  long local_2d0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2c8;
  long local_2c0;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_2b8;
  uint64_t rdx_5;
  uint64_t rax_5;
  uint64_t rdx_3;
  uint64_t rax_3;
  uint64_t rdx_4;
  uint64_t rax_4;
  uint64_t rdx_2;
  uint64_t rax_2;
  uint64_t rdx_1;
  uint64_t rax_1;
  uint64_t rdx;
  uint64_t rax;
  undefined8 *local_248;
  SourceLocationData *local_240;
  uint64_t *local_238;
  memory_order __b_11;
  int local_204;
  memory_order __b_7;
  QueueItem *local_1f8;
  memory_order __b_9;
  undefined1 *local_1d0;
  memory_order local_1c8;
  int local_1c4;
  memory_order __b_5;
  QueueItem *local_1b8;
  undefined1 *local_1b0;
  memory_order local_1a8;
  int local_1a4;
  memory_order __b_3;
  QueueItem *local_198;
  undefined1 *local_190;
  memory_order local_188;
  int local_184;
  memory_order __b_1;
  atomic<unsigned_long> *local_178;
  ExplicitProducer *local_170;
  memory_order local_168;
  int local_164;
  memory_order __b;
  ExplicitProducer *local_158;
  memory_order local_150;
  int local_14c;
  memory_order __b_2;
  ExplicitProducer *local_140;
  memory_order local_138;
  int local_134;
  memory_order __b_4;
  memory_order __b_8;
  ExplicitProducer *local_110;
  memory_order local_108;
  int local_104;
  memory_order __b_6;
  memory_order __b_10;
  uint16_t local_ca;
  uint16_t *local_c8;
  uint16_t local_ba;
  uint16_t *local_b8;
  uint id_2;
  uint local_9c;
  GpuCtx *pGStack_98;
  uint id_1;
  uint local_8c;
  GpuCtx *pGStack_88;
  uint id;
  uint local_6c;
  GpuCtx *local_68;
  uint local_5c;
  GpuCtx *local_58;
  uint8_t local_39;
  uint8_t *local_38;
  uint8_t local_29;
  uint8_t *local_28;
  GpuCtx *local_18;
  GpuCtx *local_10;
  
  local_4f0 = &local_53d;
  local_4f8 = &ImageTexture::__tracy_source_location59;
  __magic._7_1_ = 1;
  local_53d = 1;
  local_53c = type;
  uStack_538 = height;
  pEVar8 = tracy::GetToken();
  paVar4 = &(pEVar8->super_ProducerBase).tailIndex;
  local_380 = &__token;
  paVar5 = &(pEVar8->super_ProducerBase).tailIndex;
  local_164 = 0;
  local_3d8 = pEVar8;
  local_378 = pEVar8;
  ___b = paVar5;
  local_168 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_164 - 1U < 2) {
    local_170 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_164 == 5) {
    local_170 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_170 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_380 = local_170;
  bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_380 & 0xffff) == 0);
  if (bVar3) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar8,(index_t)*local_380);
  }
  local_318 = tracy::moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar8->super_ProducerBase).tailBlock,(index_t)*local_380);
  local_319 = 0xf;
  (local_318->hdr).field_0.type = ZoneBegin;
  local_2b8 = &local_318->field_1;
  uVar1 = rdtsc();
  rax_1 = CONCAT44(extraout_var,(int)((ulong)uVar1 >> 0x20));
  rdx = CONCAT44((int)((ulong)local_318 >> 0x20),(int)uVar1);
  local_2c0 = (rax_1 << 0x20) + rdx;
  (local_2b8->frameMark).time = local_2c0;
  local_238 = &(local_318->field_1).zoneBegin.srcloc;
  local_240 = local_4f8;
  *local_238 = (uint64_t)local_4f8;
  ___b_1 = (undefined1 *)((long)&(__token->super_ProducerBase)._vptr_ProducerBase + 1);
  local_184 = 3;
  local_178 = paVar4;
  local_188 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_184 == 3) {
    (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  else if (local_184 == 5) {
    LOCK();
    (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
    UNLOCK();
  }
  else {
    (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  local_190 = ___b_1;
  local_4b8 = &local_53e;
  _queryId = &ImageTexture::__tracy_gpu_source_location60;
  __magic_1._7_1_ = 1;
  local_53e = 1;
  pGVar7 = tracy::GetGpuCtx();
  pGStack_88 = pGVar7->ptr;
  __magic_1._0_4_ = pGStack_88->m_head;
  pGStack_88->m_head = pGStack_88->m_head + 1 & 0xffff;
  uVar1 = gl3wProcs.ptr[0x1b1];
  local_8c = (uint)__magic_1;
  if (pGStack_88->m_head == pGStack_88->m_tail) {
    __assert_fail("m_head != m_tail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                  ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
  }
  pGVar7 = tracy::GetGpuCtx();
  local_58 = pGVar7->ptr;
  local_5c = (uint)__magic_1;
  (*(code *)uVar1)((ulong)local_58->m_query[(uint)__magic_1],0x8e28);
  pEVar8 = tracy::GetToken();
  item_1 = (QueueItem *)&(pEVar8->super_ProducerBase).tailIndex;
  local_390 = &__token_1;
  paVar4 = &(pEVar8->super_ProducerBase).tailIndex;
  local_14c = 0;
  __tail_1 = (atomic<unsigned_long> *)pEVar8;
  local_3e0 = pEVar8;
  local_388 = pEVar8;
  ___b_2 = paVar4;
  local_150 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_14c - 1U < 2) {
    local_158 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_14c == 5) {
    local_158 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_158 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_390 = local_158;
  bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_390 & 0xffff) == 0);
  if (bVar3) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar8,(index_t)*local_390);
  }
  local_4e8 = tracy::moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar8->super_ProducerBase).tailBlock,(index_t)*local_390);
  local_329 = 0x21;
  (local_4e8->hdr).field_0.type = GpuZoneBegin;
  local_2c8 = &local_4e8->field_1;
  uVar1 = rdtsc();
  rax_2 = CONCAT44(extraout_var_00,(int)((ulong)uVar1 >> 0x20));
  rdx_1 = CONCAT44((int)((ulong)local_4e8 >> 0x20),(int)uVar1);
  local_2d0 = (rax_2 << 0x20) + rdx_1;
  (local_2c8->frameMark).time = local_2d0;
  (local_4e8->field_1).zoneEndThread.thread = 0;
  local_b8 = &(local_4e8->field_1).lockNameFat.size;
  local_ba = (uint16_t)__magic_1;
  *local_b8 = (uint16_t)__magic_1;
  puVar6 = &(local_4e8->field_1).gpuZoneBeginLean.context;
  local_328 = local_4e8;
  pGVar7 = tracy::GetGpuCtx();
  pQVar2 = item_1;
  local_10 = pGVar7->ptr;
  local_29 = local_10->m_context;
  *puVar6 = local_29;
  local_248 = (undefined8 *)((long)&(local_4e8->field_1).zoneBegin.srcloc + 7);
  rax = (uint64_t)_queryId;
  *local_248 = _queryId;
  ___b_3 = (undefined1 *)((long)&(__token_1->super_ProducerBase)._vptr_ProducerBase + 1);
  local_198 = item_1;
  local_1a4 = 3;
  local_28 = puVar6;
  local_1a8 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_1a4 == 3) {
    *(undefined1 **)pQVar2 = ___b_3;
  }
  else if (local_1a4 == 5) {
    LOCK();
    *(undefined1 **)pQVar2 = ___b_3;
    UNLOCK();
  }
  else {
    *(undefined1 **)pQVar2 = ___b_3;
  }
  local_1b0 = ___b_3;
  this->m_width = width;
  this->m_height = uStack_538;
  this->m_channels = 4;
  (*gl3wProcs.ptr[0xb1])(1);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)this->m_id);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2801,0x2703);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2800,0x2601);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2802,0x2901);
  (*gl3wProcs.ptr[0x1da])(0xde1,0x2803,0x2901);
  (*gl3wProcs.ptr[0x1d2])
            (0xde1,0,(ulong)local_53c,(ulong)this->m_width,(ulong)this->m_height,0,0x1908,0x1401,
             data);
  (*gl3wProcs.ptr[0xb4])(0xde1);
  (*gl3wProcs.ptr[0x16])(0xde1,0);
  pbStack_488 = &local_53e;
  if ((local_53e & 1) != 0) {
    pGVar7 = tracy::GetGpuCtx();
    pGStack_98 = pGVar7->ptr;
    __magic_2._4_4_ = pGStack_98->m_head;
    pGStack_98->m_head = pGStack_98->m_head + 1 & 0xffff;
    uVar1 = gl3wProcs.ptr[0x1b1];
    local_9c = __magic_2._4_4_;
    if (pGStack_98->m_head == pGStack_98->m_tail) {
      __assert_fail("m_head != m_tail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                    ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
    }
    pGVar7 = tracy::GetGpuCtx();
    local_68 = pGVar7->ptr;
    local_6c = __magic_2._4_4_;
    (*(code *)uVar1)((ulong)local_68->m_query[__magic_2._4_4_],0x8e28);
    pEVar8 = tracy::GetToken();
    item_2 = (QueueItem *)&(pEVar8->super_ProducerBase).tailIndex;
    local_3a0 = &__token_2;
    paVar4 = &(pEVar8->super_ProducerBase).tailIndex;
    local_134 = 0;
    __tail_2 = (atomic<unsigned_long> *)pEVar8;
    local_3e8 = pEVar8;
    local_398 = pEVar8;
    ___b_4 = paVar4;
    local_138 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_134 - 1U < 2) {
      local_140 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_134 == 5) {
      local_140 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_140 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_3a0 = local_140;
    bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_3a0 & 0xffff) == 0);
    if (bVar3) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar8,(index_t)*local_3a0);
    }
    local_4b0 = tracy::moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar8->super_ProducerBase).tailBlock,(index_t)*local_3a0);
    local_339 = 0x25;
    (local_4b0->hdr).field_0.type = GpuZoneEnd;
    local_2d8 = &local_4b0->field_1;
    uVar1 = rdtsc();
    rax_4 = CONCAT44(extraout_var_01,(int)((ulong)uVar1 >> 0x20));
    rdx_2 = CONCAT44((int)((ulong)local_4b0 >> 0x20),(int)uVar1);
    local_2e0 = (rax_4 << 0x20) + rdx_2;
    (local_2d8->frameMark).time = local_2e0;
    (local_4b0->field_1).zoneEndThread.thread = 0;
    local_c8 = &(local_4b0->field_1).lockNameFat.size;
    local_ca = __magic_2._4_2_;
    *local_c8 = __magic_2._4_2_;
    puVar6 = &(local_4b0->field_1).gpuZoneBeginLean.context;
    local_338 = local_4b0;
    pGVar7 = tracy::GetGpuCtx();
    pQVar2 = item_2;
    local_18 = pGVar7->ptr;
    local_39 = local_18->m_context;
    *puVar6 = local_39;
    ___b_5 = (undefined1 *)((long)&(__token_2->super_ProducerBase)._vptr_ProducerBase + 1);
    local_1b8 = item_2;
    local_1c4 = 3;
    local_38 = puVar6;
    local_1c8 = std::operator&(memory_order_release,__memory_order_mask);
    local_1d0 = ___b_5;
    if (local_1c4 == 3) {
      *(undefined1 **)pQVar2 = ___b_5;
    }
    else if (local_1c4 == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_5;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_5;
    }
  }
  __magic_3 = (index_t)&local_53d;
  if ((local_53d & 1) != 0) {
    pEVar8 = tracy::GetToken();
    item_3 = (QueueItem *)&(pEVar8->super_ProducerBase).tailIndex;
    local_3c0 = &__token_3;
    paVar4 = &(pEVar8->super_ProducerBase).tailIndex;
    local_104 = 0;
    __tail_3 = (atomic<unsigned_long> *)pEVar8;
    local_3f8 = pEVar8;
    local_3b8 = pEVar8;
    ___b_6 = paVar4;
    local_108 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_104 - 1U < 2) {
      local_110 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_104 == 5) {
      local_110 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_110 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_3c0 = local_110;
    bVar3 = tracy::moodycamel::details::cqUnlikely(((ulong)*local_3c0 & 0xffff) == 0);
    if (bVar3) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar8,(index_t)*local_3c0);
    }
    local_450 = tracy::moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar8->super_ProducerBase).tailBlock,(index_t)*local_3c0);
    pQVar2 = item_3;
    local_359 = 0x11;
    (local_450->hdr).field_0.type = ZoneEnd;
    local_2f8 = &local_450->field_1;
    uVar1 = rdtsc();
    rax_5 = CONCAT44(extraout_var_02,(int)((ulong)uVar1 >> 0x20));
    rdx_3 = CONCAT44((int)((ulong)local_450 >> 0x20),(int)uVar1);
    local_300 = (rax_5 << 0x20) + rdx_3;
    (local_2f8->frameMark).time = local_300;
    ___b_7 = (undefined1 *)((long)&(__token_3->super_ProducerBase)._vptr_ProducerBase + 1);
    local_1f8 = item_3;
    local_204 = 3;
    local_358 = local_450;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_204 == 3) {
      *(undefined1 **)pQVar2 = ___b_7;
    }
    else if (local_204 == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_7;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_7;
    }
  }
  return;
}

Assistant:

ImageTexture::ImageTexture(unsigned char* data, unsigned int width, unsigned int height, unsigned int type)
{
    ZoneScoped;
    TracyGpuZone("ImageTexture::ImageTexture");
    m_width = width;
    m_height = height;
    m_channels = 4;
    glGenTextures(1, &m_id);
    glBindTexture(GL_TEXTURE_2D, m_id);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
	glTexImage2D(GL_TEXTURE_2D, 0, type, m_width, m_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
    glGenerateMipmap(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, 0);
}